

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_get_argument_property
              (p_ply_argument argument,p_ply_property *property,long *length,long *value_index)

{
  if (argument != (p_ply_argument)0x0) {
    if (property != (p_ply_property *)0x0) {
      *property = argument->property;
    }
    if (length != (long *)0x0) {
      *length = argument->length;
    }
    if (value_index != (long *)0x0) {
      *value_index = argument->value_index;
    }
    return 1;
  }
  return 0;
}

Assistant:

int ply_get_argument_property(p_ply_argument argument, p_ply_property *property,
                              long *length, long *value_index) {
    assert(argument);
    if (!argument) return 0;
    if (property) *property = argument->property;
    if (length) *length = argument->length;
    if (value_index) *value_index = argument->value_index;
    return 1;
}